

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_schnorr.cpp
# Opt level: O2

SchnorrPubkeyDataStruct *
cfd::js::api::json::SchnorrApi::TweakAddSchnorrPubkeyFromPubkey
          (SchnorrPubkeyDataStruct *__return_storage_ptr__,TweakPubkeyDataStruct *request)

{
  string *in_R8;
  allocator local_129;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  function<cfd::js::api::SchnorrPubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&)>
  local_100;
  SchnorrPubkeyDataStruct local_e0;
  
  SchnorrPubkeyDataStruct::SchnorrPubkeyDataStruct(__return_storage_ptr__);
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<cfd::js::api::SchnorrPubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_schnorr.cpp:104:7)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<cfd::js::api::SchnorrPubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_schnorr.cpp:104:7)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_100,"TweakAddSchnorrPubkeyFromPubkey",&local_129);
  ExecuteStructApi<cfd::js::api::TweakPubkeyDataStruct,cfd::js::api::SchnorrPubkeyDataStruct>
            (&local_e0,(api *)request,(TweakPubkeyDataStruct *)&local_128,&local_100,in_R8);
  SchnorrPubkeyDataStruct::operator=(__return_storage_ptr__,&local_e0);
  SchnorrPubkeyDataStruct::~SchnorrPubkeyDataStruct(&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkeyDataStruct SchnorrApi::TweakAddSchnorrPubkeyFromPubkey(
    const TweakPubkeyDataStruct& request) {
  auto call_func =
      [](const TweakPubkeyDataStruct& request) -> SchnorrPubkeyDataStruct {
    SchnorrPubkeyDataStruct response;

    SchnorrPubkey pubkey(request.pubkey);
    ByteData256 tweak(request.tweak);
    bool parity = false;
    auto tweaked_pubkey = pubkey.CreateTweakAdd(tweak, &parity);
    response.pubkey = tweaked_pubkey.GetHex();
    response.parity = parity;
    return response;
  };

  SchnorrPubkeyDataStruct result;
  result = ExecuteStructApi<TweakPubkeyDataStruct, SchnorrPubkeyDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}